

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

JsArrayKills __thiscall GlobOpt::CheckJsArrayKills(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  IndirOpnd *pIVar9;
  RegOpnd *pRVar10;
  ProfiledInstr *pPVar11;
  PropertySym *pPVar12;
  Opnd *pOVar13;
  HelperCallOpnd *pHVar14;
  ScriptContextInfo *pSVar15;
  undefined4 extraout_var;
  bool local_a9;
  bool local_a8;
  bool local_a7;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_92;
  Opnd *pOStack_90;
  ValueType arrayValueType_3;
  Opnd *arrayOpnd_3;
  JnHelperMethod helperMethod;
  ValueType arrayValueType_2;
  Opnd *arrayOpnd_2;
  Opnd *pOStack_70;
  ValueType arrayValueType_1;
  Opnd *arrayOpnd_1;
  Opnd *pOStack_60;
  ValueType arrayValueType;
  Opnd *arrayOpnd;
  PropertySymOpnd *local_50;
  PropertySymOpnd *dst;
  SymOpnd *symDst;
  StElemInfo *local_38;
  StElemInfo *stElemInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_28;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_26;
  ValueType baseValueType;
  bool useValueTypes;
  bool doArrayLengthHoist;
  bool doArraySegmentHoist;
  bool doNativeArrayTypeSpec;
  bool doArrayMissingValueCheckHoist;
  Instr *instr_local;
  GlobOpt *this_local;
  JsArrayKills kills;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3564,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  JsArrayKills::JsArrayKills((JsArrayKills *)((long)&this_local + 7));
  bVar3 = IR::Instr::UsesAllFields(instr);
  if (bVar3) {
    JsArrayKills::SetKillsAllArrays((JsArrayKills *)((long)&this_local + 7));
    return (JsArrayKills)this_local._7_1_.bits;
  }
  bVar3 = DoArrayMissingValueCheckHoist(this);
  bVar4 = DoNativeArrayTypeSpec(this);
  local_26.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetObject(Array);
  bVar5 = DoArraySegmentHoist(this,(ValueType)local_26.field_0);
  baseValueType.field_0.bits._1_1_ = bVar5;
  local_28.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetObject(ObjectWithArray);
  bVar6 = DoArraySegmentHoist(this,(ValueType)local_28.field_0);
  if (bVar5 != bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3572,
                       "(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)))"
                       ,
                       "doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray))"
                      );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  stElemInfo._7_1_ = DoArrayLengthHoist(this);
  if ((((!bVar3) && (!bVar4)) && ((baseValueType.field_0.bits._1_1_ & 1) == 0)) &&
     (!(bool)stElemInfo._7_1_)) {
    return (JsArrayKills)this_local._7_1_;
  }
  bVar5 = IsLoopPrePass(this);
  stElemInfo._6_1_ = !bVar5;
  OVar1 = instr->m_opcode;
  if (((OVar1 == StFld) || (OVar1 == StFldStrict)) || ((ushort)(OVar1 - ScopedStFld) < 2)) {
LAB_005804f2:
    pOVar13 = IR::Instr::GetDst(instr);
    if (pOVar13 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35bc,"(instr->GetDst())","instr->GetDst()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (((baseValueType.field_0.bits._1_1_ & 1) != 0) || ((stElemInfo._7_1_ & 1) != 0)) {
      pOVar13 = IR::Instr::GetDst(instr);
      dst = (PropertySymOpnd *)IR::Opnd::AsSymOpnd(pOVar13);
      bVar3 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)dst);
      if (bVar3) {
        local_50 = IR::Opnd::AsPropertySymOpnd((Opnd *)dst);
        pPVar12 = Sym::AsPropertySym((local_50->super_SymOpnd).m_sym);
        if (pPVar12->m_propertyId == 0xd1) {
          local_a9 = false;
          if ((stElemInfo._6_1_ & 1) != 0) {
            arrayOpnd._6_2_ =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 IR::SymOpnd::GetPropertyOwnerValueType(&local_50->super_SymOpnd);
            local_a9 = ValueType::IsNotArray((ValueType *)((long)&arrayOpnd + 6));
          }
          if (local_a9 == false) {
            if ((baseValueType.field_0.bits._1_1_ & 1) != 0) {
              JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7))
              ;
            }
            if ((stElemInfo._7_1_ & 1) != 0) {
              JsArrayKills::SetKillsArrayLengths((JsArrayKills *)((long)&this_local + 7));
            }
          }
        }
      }
    }
  }
  else {
    if ((OVar1 == StElemI_A) || (OVar1 == StElemI_A_Strict)) {
LAB_00580264:
      pOVar13 = IR::Instr::GetDst(instr);
      if (pOVar13 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3584,"(instr->GetDst())","instr->GetDst()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pOVar13 = IR::Instr::GetDst(instr);
      bVar3 = IR::Opnd::IsIndirOpnd(pOVar13);
      if (!bVar3) {
        return (JsArrayKills)this_local._7_1_.bits;
      }
      if ((stElemInfo._6_1_ & 1) == 0) {
        stElemInfo._4_2_ = ValueType::Uninitialized.field_0;
      }
      else {
        pOVar13 = IR::Instr::GetDst(instr);
        pIVar9 = IR::Opnd::AsIndirOpnd(pOVar13);
        pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
        stElemInfo._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&pRVar10->super_Opnd);
      }
      if (((stElemInfo._6_1_ & 1) != 0) &&
         (bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&stElemInfo + 4)),
         bVar3)) {
        return (JsArrayKills)this_local._7_1_.bits;
      }
      bVar3 = IR::Instr::IsProfiledInstr(instr);
      if (!bVar3) {
        return (JsArrayKills)this_local._7_1_.bits;
      }
      pPVar11 = IR::Instr::AsProfiledInstr(instr);
      local_38 = (pPVar11->u).stElemInfo;
      if (((baseValueType.field_0.bits._1_1_ & 1) != 0) &&
         (bVar3 = Js::StElemInfo::LikelyStoresOutsideHeadSegmentBounds(local_38), bVar3)) {
        JsArrayKills::SetKillsArrayHeadSegments((JsArrayKills *)((long)&this_local + 7));
        JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7));
      }
      if ((stElemInfo._7_1_ & 1) == 0) {
        return (JsArrayKills)this_local._7_1_;
      }
      if (((stElemInfo._6_1_ & 1) != 0) &&
         (bVar3 = ValueType::IsNotArray((ValueType *)((long)&stElemInfo + 4)), bVar3)) {
        return (JsArrayKills)this_local._7_1_;
      }
      bVar3 = Js::StElemInfo::LikelyStoresOutsideArrayBounds(local_38);
      if (!bVar3) {
        return (JsArrayKills)this_local._7_1_;
      }
      JsArrayKills::SetKillsArrayLengths((JsArrayKills *)((long)&this_local + 7));
      return (JsArrayKills)this_local._7_1_;
    }
    if ((ushort)(OVar1 - DeleteElemI_A) < 2) {
      pOVar13 = IR::Instr::GetSrc1(instr);
      if (pOVar13 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x35a3,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pOVar13 = IR::Instr::GetSrc1(instr);
      bVar4 = IR::Opnd::IsIndirOpnd(pOVar13);
      local_a7 = true;
      if (bVar4) {
        local_a8 = false;
        if ((stElemInfo._6_1_ & 1) != 0) {
          pOVar13 = IR::Instr::GetSrc1(instr);
          pIVar9 = IR::Opnd::AsIndirOpnd(pOVar13);
          pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
          symDst._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         IR::Opnd::GetValueType(&pRVar10->super_Opnd);
          local_a8 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&symDst + 6));
        }
        local_a7 = local_a8;
      }
      if (local_a7 != false) {
        return (JsArrayKills)this_local._7_1_;
      }
      if (bVar3) {
        JsArrayKills::SetKillsArraysWithNoMissingValues((JsArrayKills *)((long)&this_local + 7));
      }
      if ((baseValueType.field_0.bits._1_1_ & 1) == 0) {
        return (JsArrayKills)this_local._7_1_;
      }
      JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7));
      return (JsArrayKills)this_local._7_1_;
    }
    if (OVar1 != NewScObjectNoCtorFull) {
      if (((OVar1 == StSuperFld) || (OVar1 == StSuperFldStrict)) ||
         ((ushort)(OVar1 - ConsoleScopedStFld) < 2)) goto LAB_005804f2;
      if (OVar1 == InitProto) {
        pOStack_90 = IR::Instr::GetSrc1(instr);
        if (pOStack_90 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3675,"(arrayOpnd)","arrayOpnd");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        local_92.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(pOStack_90);
        bVar3 = IR::Opnd::IsRegOpnd(pOStack_90);
        if (!bVar3) {
          return (JsArrayKills)this_local._7_1_;
        }
        if (((stElemInfo._6_1_ & 1) != 0) &&
           (bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_92.field_0), bVar3))
        {
          return (JsArrayKills)this_local._7_1_;
        }
        if (!bVar4) {
          return (JsArrayKills)this_local._7_1_;
        }
        if (((stElemInfo._6_1_ & 1) != 0) &&
           (bVar3 = ValueType::IsNotNativeArray((ValueType *)&local_92.field_0), bVar3)) {
          return (JsArrayKills)this_local._7_1_;
        }
        JsArrayKills::SetKillsNativeArrays((JsArrayKills *)((long)&this_local + 7));
        return (JsArrayKills)this_local._7_1_.bits;
      }
      if (OVar1 == CallDirect) {
        pOVar13 = IR::Instr::GetSrc1(instr);
        if (pOVar13 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x362a,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        _helperMethod = IR::Instr::FindCallArgumentOpnd(instr,1,(Instr **)0x0);
        if (_helperMethod == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x362e,"(arrayOpnd)","arrayOpnd");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        arrayOpnd_3._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(_helperMethod);
        bVar5 = IR::Opnd::IsRegOpnd(_helperMethod);
        if (!bVar5) {
          return (JsArrayKills)this_local._7_1_;
        }
        if (((stElemInfo._6_1_ & 1) != 0) &&
           (bVar5 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&arrayOpnd_3 + 6)),
           bVar5)) {
          return (JsArrayKills)this_local._7_1_;
        }
        pOVar13 = IR::Instr::GetSrc1(instr);
        pHVar14 = IR::Opnd::AsHelperCallOpnd(pOVar13);
        arrayOpnd_3._0_4_ = pHVar14->m_fnHelper;
        if ((bVar3) &&
           (((JnHelperMethod)arrayOpnd_3 - HelperArray_Reverse < 2 ||
            ((JnHelperMethod)arrayOpnd_3 == HelperArray_Splice ||
             (JnHelperMethod)arrayOpnd_3 == HelperArray_Unshift)))) {
          JsArrayKills::SetKillsArraysWithNoMissingValues((JsArrayKills *)((long)&this_local + 7));
        }
        if (((baseValueType.field_0.bits._1_1_ & 1) != 0) &&
           ((((JnHelperMethod)arrayOpnd_3 == HelperArray_Concat ||
             ((JnHelperMethod)arrayOpnd_3 - HelperArray_Reverse < 2)) ||
            ((JnHelperMethod)arrayOpnd_3 == HelperArray_Splice ||
             (JnHelperMethod)arrayOpnd_3 == HelperArray_Unshift)))) {
          JsArrayKills::SetKillsArrayHeadSegments((JsArrayKills *)((long)&this_local + 7));
          JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7));
        }
        if ((((stElemInfo._7_1_ & 1) != 0) &&
            (((stElemInfo._6_1_ & 1) == 0 ||
             (bVar3 = ValueType::IsNotArray((ValueType *)((long)&arrayOpnd_3 + 6)), !bVar3)))) &&
           (((JnHelperMethod)arrayOpnd_3 == HelperArray_Shift ||
            ((JnHelperMethod)arrayOpnd_3 == HelperArray_Splice ||
             (JnHelperMethod)arrayOpnd_3 == HelperArray_Unshift)))) {
          JsArrayKills::SetKillsArrayLengths((JsArrayKills *)((long)&this_local + 7));
        }
        if (!bVar4) {
          return (JsArrayKills)this_local._7_1_;
        }
        if (((stElemInfo._6_1_ & 1) != 0) &&
           (bVar3 = ValueType::IsNotNativeArray((ValueType *)((long)&arrayOpnd_3 + 6)), bVar3)) {
          return (JsArrayKills)this_local._7_1_;
        }
        if (((JnHelperMethod)arrayOpnd_3 != HelperArray_Concat) &&
           (4 < (JnHelperMethod)arrayOpnd_3 - HelperArray_Reverse)) {
          return (JsArrayKills)this_local._7_1_;
        }
        JsArrayKills::SetKillsNativeArrays((JsArrayKills *)((long)&this_local + 7));
        return (JsArrayKills)this_local._7_1_;
      }
      if (OVar1 == NewClassProto) {
        pOVar13 = IR::Instr::GetSrc1(instr);
        if (pOVar13 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3684,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pOVar13 = IR::Instr::GetSrc1(instr);
        pSVar15 = Func::GetScriptContextInfo(this->func);
        iVar7 = (*pSVar15->_vptr_ScriptContextInfo[0x19])();
        bVar3 = IR::AddrOpnd::IsEqualAddr(pOVar13,(void *)CONCAT44(extraout_var,iVar7));
        if (bVar3) {
          return (JsArrayKills)this_local._7_1_;
        }
      }
      else if (OVar1 != NewScObjectNoCtor) {
        if (OVar1 != StElemC) {
          if (OVar1 != InlineArrayPop) {
            if (OVar1 != InlineArrayPush) {
              return (JsArrayKills)this_local._7_1_;
            }
            pOVar13 = IR::Instr::GetSrc2(instr);
            if (pOVar13 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x35e3,"(instr->GetSrc2())","instr->GetSrc2()");
              if (!bVar5) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            pOStack_60 = IR::Instr::GetSrc1(instr);
            if (pOStack_60 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x35e5,"(arrayOpnd)","arrayOpnd");
              if (!bVar5) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            arrayOpnd_1._6_2_ =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 IR::Opnd::GetValueType(pOStack_60);
            bVar5 = IR::Opnd::IsRegOpnd(pOStack_60);
            if (!bVar5) {
              return (JsArrayKills)this_local._7_1_;
            }
            if (((stElemInfo._6_1_ & 1) != 0) &&
               (bVar5 = ValueType::IsNotArrayOrObjectWithArray
                                  ((ValueType *)((long)&arrayOpnd_1 + 6)), bVar5)) {
              return (JsArrayKills)this_local._7_1_;
            }
            if (bVar3) {
              JsArrayKills::SetKillsArraysWithNoMissingValues
                        ((JsArrayKills *)((long)&this_local + 7));
            }
            if ((baseValueType.field_0.bits._1_1_ & 1) != 0) {
              JsArrayKills::SetKillsArrayHeadSegments((JsArrayKills *)((long)&this_local + 7));
              JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7))
              ;
            }
            if (((stElemInfo._7_1_ & 1) != 0) &&
               (((stElemInfo._6_1_ & 1) == 0 ||
                (bVar3 = ValueType::IsNotArray((ValueType *)((long)&arrayOpnd_1 + 6)), !bVar3)))) {
              JsArrayKills::SetKillsArrayLengths((JsArrayKills *)((long)&this_local + 7));
            }
            if (!bVar4) {
              return (JsArrayKills)this_local._7_1_.bits;
            }
            if (((stElemInfo._6_1_ & 1) != 0) &&
               (bVar3 = ValueType::IsNativeArray((ValueType *)((long)&arrayOpnd_1 + 6)), bVar3)) {
              bVar3 = ValueType::IsLikelyNativeIntArray((ValueType *)((long)&arrayOpnd_1 + 6));
              if (bVar3) {
                pOVar13 = IR::Instr::GetSrc2(instr);
                bVar3 = IR::Opnd::IsInt32(pOVar13);
                if (bVar3) {
                  return (JsArrayKills)this_local._7_1_.bits;
                }
              }
              bVar3 = ValueType::IsLikelyNativeFloatArray((ValueType *)((long)&arrayOpnd_1 + 6));
              if (bVar3) {
                pOVar13 = IR::Instr::GetSrc2(instr);
                bVar3 = IR::Opnd::IsFloat(pOVar13);
                if (bVar3) {
                  return (JsArrayKills)this_local._7_1_.bits;
                }
              }
            }
            if (((stElemInfo._6_1_ & 1) != 0) &&
               (bVar3 = ValueType::IsNotNativeArray((ValueType *)((long)&arrayOpnd_1 + 6)), bVar3))
            {
              return (JsArrayKills)this_local._7_1_.bits;
            }
            JsArrayKills::SetKillsNativeArrays((JsArrayKills *)((long)&this_local + 7));
            return (JsArrayKills)this_local._7_1_.bits;
          }
          pOStack_70 = IR::Instr::GetSrc1(instr);
          if (pOStack_70 == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x360f,"(arrayOpnd)","arrayOpnd");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          arrayOpnd_2._6_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(pOStack_70);
          bVar4 = IR::Opnd::IsRegOpnd(pOStack_70);
          if (!bVar4) {
            return (JsArrayKills)this_local._7_1_;
          }
          if (((stElemInfo._6_1_ & 1) != 0) &&
             (bVar4 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&arrayOpnd_2 + 6)),
             bVar4)) {
            return (JsArrayKills)this_local._7_1_;
          }
          if ((baseValueType.field_0.bits._1_1_ & 1) != 0) {
            JsArrayKills::SetKillsArrayHeadSegmentLengths((JsArrayKills *)((long)&this_local + 7));
          }
          if (((stElemInfo._7_1_ & 1) != 0) &&
             (((stElemInfo._6_1_ & 1) == 0 ||
              (bVar4 = ValueType::IsNotArray((ValueType *)((long)&arrayOpnd_2 + 6)), !bVar4)))) {
            JsArrayKills::SetKillsArrayLengths((JsArrayKills *)((long)&this_local + 7));
          }
          if (!bVar3) {
            return (JsArrayKills)this_local._7_1_;
          }
          if (((stElemInfo._6_1_ & 1) != 0) &&
             (bVar3 = ValueType::IsArray((ValueType *)((long)&arrayOpnd_2 + 6)), bVar3)) {
            return (JsArrayKills)this_local._7_1_;
          }
          JsArrayKills::SetKillsObjectArraysWithNoMissingValues
                    ((JsArrayKills *)((long)&this_local + 7));
          return (JsArrayKills)this_local._7_1_.bits;
        }
        goto LAB_00580264;
      }
    }
    if (bVar4) {
      JsArrayKills::SetKillsNativeArrays((JsArrayKills *)((long)&this_local + 7));
    }
  }
  return (anon_union_1_2_471f577c_for_JsArrayKills_0)
         (anon_union_1_2_471f577c_for_JsArrayKills_0)this_local._7_1_;
}

Assistant:

JsArrayKills
GlobOpt::CheckJsArrayKills(IR::Instr *const instr)
{
    Assert(instr);

    JsArrayKills kills;
    if(instr->UsesAllFields())
    {
        // Calls can (but are unlikely to) change a javascript array into an ES5 array, which may have different behavior for
        // index properties.
        kills.SetKillsAllArrays();
        return kills;
    }

    const bool doArrayMissingValueCheckHoist = DoArrayMissingValueCheckHoist();
    const bool doNativeArrayTypeSpec = DoNativeArrayTypeSpec();
    const bool doArraySegmentHoist = DoArraySegmentHoist(ValueType::GetObject(ObjectType::Array));
    Assert(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)));
    const bool doArrayLengthHoist = DoArrayLengthHoist();
    if(!doArrayMissingValueCheckHoist && !doNativeArrayTypeSpec && !doArraySegmentHoist && !doArrayLengthHoist)
    {
        return kills;
    }

    // The following operations may create missing values in an array in an unlikely circumstance. Even though they don't kill
    // the fact that the 'this' parameter is an array (when implicit calls are disabled), we don't have a way to say the value
    // type is definitely array but it likely has no missing values. So, these will kill the definite value type as well, making
    // it likely array, such that the array checks will have to be redone.
    const bool useValueTypes = !IsLoopPrePass(); // Source value types are not guaranteed to be correct in a loop prepass
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        {
            Assert(instr->GetDst());
            if(!instr->GetDst()->IsIndirOpnd())
            {
                break;
            }
            const ValueType baseValueType =
                useValueTypes ? instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType() : ValueType::Uninitialized;
            if(useValueTypes && baseValueType.IsNotArrayOrObjectWithArray())
            {
                break;
            }
            if(instr->IsProfiledInstr())
            {
                const Js::StElemInfo *const stElemInfo = instr->AsProfiledInstr()->u.stElemInfo;
                if(doArraySegmentHoist && stElemInfo->LikelyStoresOutsideHeadSegmentBounds())
                {
                    kills.SetKillsArrayHeadSegments();
                    kills.SetKillsArrayHeadSegmentLengths();
                }
                if(doArrayLengthHoist &&
                    !(useValueTypes && baseValueType.IsNotArray()) &&
                    stElemInfo->LikelyStoresOutsideArrayBounds())
                {
                    kills.SetKillsArrayLengths();
                }
            }
            break;
        }

        case Js::OpCode::DeleteElemI_A:
        case Js::OpCode::DeleteElemIStrict_A:
            Assert(instr->GetSrc1());
            if(!instr->GetSrc1()->IsIndirOpnd() ||
                (useValueTypes && instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsNotArrayOrObjectWithArray()))
            {
                break;
            }
            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }
            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            break;

        case Js::OpCode::ConsoleScopedStFld:
        case Js::OpCode::ConsoleScopedStFldStrict:
        case Js::OpCode::ScopedStFld:
        case Js::OpCode::ScopedStFldStrict:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
        case Js::OpCode::StSuperFld:
        case Js::OpCode::StSuperFldStrict:
        {
            Assert(instr->GetDst());

            if(!doArraySegmentHoist && !doArrayLengthHoist)
            {
                break;
            }

            IR::SymOpnd *const symDst = instr->GetDst()->AsSymOpnd();
            if(!symDst->IsPropertySymOpnd())
            {
                break;
            }

            IR::PropertySymOpnd *const dst = symDst->AsPropertySymOpnd();
            if(dst->m_sym->AsPropertySym()->m_propertyId != Js::PropertyIds::length)
            {
                break;
            }

            if(useValueTypes && dst->GetPropertyOwnerValueType().IsNotArray())
            {
                // Setting the 'length' property of an object that is not an array, even if it has an internal array, does
                // not kill the head segment or head segment length of any arrays.
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            if(doArrayLengthHoist)
            {
                kills.SetKillsArrayLengths();
            }
            break;
        }

        case Js::OpCode::InlineArrayPush:
        {
            Assert(instr->GetSrc2());
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());

            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegments();
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            // Don't kill NativeArray, if there is no mismatch between array's type and element's type.
            if(doNativeArrayTypeSpec &&
               !(useValueTypes && arrayValueType.IsNativeArray() &&
                    ((arrayValueType.IsLikelyNativeIntArray() && instr->GetSrc2()->IsInt32()) ||
                     (arrayValueType.IsLikelyNativeFloatArray() && instr->GetSrc2()->IsFloat()))
                ) &&
               !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }

            break;
        }

        case Js::OpCode::InlineArrayPop:
        {
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            if(doArrayMissingValueCheckHoist && !(useValueTypes && arrayValueType.IsArray()))
            {
                kills.SetKillsObjectArraysWithNoMissingValues();
            }
            break;
        }

        case Js::OpCode::CallDirect:
        {
            Assert(instr->GetSrc1());

            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->FindCallArgumentOpnd(1);
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            const IR::JnHelperMethod helperMethod = instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper;
            if(doArrayMissingValueCheckHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArraysWithNoMissingValues();
                        break;
                }
            }

            if(doArraySegmentHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsArrayHeadSegments();
                        kills.SetKillsArrayHeadSegmentLengths();
                        break;
                }
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArrayLengths();
                        break;
                }
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Slice:
                    // Currently not inlined.
                    //case IR::HelperArray_Sort:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsNativeArrays();
                        break;
                }
            }
            break;
        }

        case Js::OpCode::InitProto:
        {
            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }
            break;
        }            

        case Js::OpCode::NewClassProto:
            Assert(instr->GetSrc1());
            if (IR::AddrOpnd::IsEqualAddr(instr->GetSrc1(), (void*)func->GetScriptContextInfo()->GetObjectPrototypeAddr()))
            {
                // No extends operand, the proto parent is the Object prototype
                break;
            }
            // Fall through
        case Js::OpCode::NewScObjectNoCtor:
        case Js::OpCode::NewScObjectNoCtorFull:
            if(doNativeArrayTypeSpec)
            {
                // Class/object construction can make something a prototype
                kills.SetKillsNativeArrays();
            }
            break;
    }

    return kills;
}